

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPAffinityClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPAffinityClause *this)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppvVar4;
  reference ppcVar5;
  ulong uVar6;
  string local_d0;
  string local_b0 [39];
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  uint local_64;
  OpenMPAffinityClauseModifier local_60;
  uint i;
  OpenMPAffinityClauseModifier modifier;
  string clause_string;
  allocator<char> local_22;
  byte local_21;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
  *local_20;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
  *iterators_definition_class;
  OpenMPAffinityClause *this_local;
  string *result;
  
  iterators_definition_class =
       (vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
        *)this;
  this_local = (OpenMPAffinityClause *)__return_storage_ptr__;
  local_20 = getIteratorsDefinitionClass(this);
  local_21 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"affinity ",&local_22);
  std::allocator<char>::~allocator(&local_22);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&modifier,"(",(allocator<char> *)((long)&i + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  local_60 = getModifier(this);
  if (local_60 == OMPC_AFFINITY_MODIFIER_iterator) {
    std::__cxx11::string::operator+=((string *)&modifier,"iterator");
    std::__cxx11::string::operator+=((string *)&modifier," ( ");
    for (local_64 = 0; uVar6 = (ulong)local_64,
        sVar3 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::size(local_20), uVar6 < sVar3; local_64 = local_64 + 1) {
      ppvVar4 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(local_20,(ulong)local_64);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,0);
      std::__cxx11::string::operator+=((string *)&modifier,*ppcVar5);
      ppvVar4 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(local_20,(ulong)local_64);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,0);
      iVar2 = strcmp(*ppcVar5,"");
      if (iVar2 != 0) {
        std::__cxx11::string::operator+=((string *)&modifier," ");
      }
      ppvVar4 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(local_20,(ulong)local_64);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,1);
      std::__cxx11::string::operator+=((string *)&modifier,*ppcVar5);
      std::__cxx11::string::operator+=((string *)&modifier,"=");
      ppvVar4 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(local_20,(ulong)local_64);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,2);
      std::__cxx11::string::operator+=((string *)&modifier,*ppcVar5);
      std::__cxx11::string::operator+=((string *)&modifier,":");
      ppvVar4 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(local_20,(ulong)local_64);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,3);
      std::__cxx11::string::operator+=((string *)&modifier,*ppcVar5);
      ppvVar4 = std::
                vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                ::at(local_20,(ulong)local_64);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,4);
      __s = *ppcVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
      bVar1 = std::operator!=(&local_88,"");
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)&modifier,":");
        ppvVar4 = std::
                  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                  ::at(local_20,(ulong)local_64);
        ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::at(*ppvVar4,4);
        std::__cxx11::string::operator+=((string *)&modifier,*ppcVar5);
      }
      std::__cxx11::string::operator+=((string *)&modifier,", ");
    }
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_b0,(ulong)&modifier);
    std::__cxx11::string::operator=((string *)&modifier,local_b0);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::operator+=((string *)&modifier," )");
  }
  uVar6 = std::__cxx11::string::size();
  if (1 < uVar6) {
    std::__cxx11::string::operator+=((string *)&modifier," : ");
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_d0,&this->super_OpenMPClause);
  std::__cxx11::string::operator+=((string *)&modifier,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::operator+=((string *)&modifier,") ");
  uVar6 = std::__cxx11::string::size();
  if (3 < uVar6) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&modifier);
  }
  local_21 = 1;
  std::__cxx11::string::~string((string *)&modifier);
  if ((local_21 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPAffinityClause::toString() {
    std::vector<vector<const char*>* >* iterators_definition_class = this->getIteratorsDefinitionClass();
    std::string result = "affinity ";
    std::string clause_string = "(";
    OpenMPAffinityClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_AFFINITY_MODIFIER_iterator:
            clause_string += "iterator";
            clause_string += " ( ";
            for (unsigned int i = 0; i <iterators_definition_class->size(); i++){
                clause_string += iterators_definition_class->at(i)->at(0);
                if (strcmp(iterators_definition_class->at(i)->at(0), "\0") != 0) { clause_string +=" "; };
                clause_string +=iterators_definition_class->at(i)->at(1);
                clause_string +="=";
                clause_string +=iterators_definition_class->at(i)->at(2);
                clause_string +=":";
                clause_string +=iterators_definition_class->at(i)->at(3);
                if ((string)iterators_definition_class->at(i)->at(4) != "") {
                    clause_string +=":";clause_string +=iterators_definition_class->at(i)->at(4);
                }
                clause_string += ", ";
            };
            clause_string = clause_string.substr(0, clause_string.size()-2);
            clause_string += " )";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}